

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,string *attribute)

{
  ulong uVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *in_RSI;
  XmlWriter *in_RDI;
  XmlEncode *in_stack_ffffffffffffff88;
  XmlEncode *in_stack_ffffffffffffffa0;
  string local_40;
  string *local_10;
  
  local_10 = in_RSI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)in_RDI->m_os,' ');
      poVar2 = std::operator<<(poVar2,local_10);
      poVar2 = std::operator<<(poVar2,"=\"");
      XmlEncode::XmlEncode(in_stack_ffffffffffffffa0,&local_40,(ForWhat)((ulong)poVar2 >> 0x20));
      poVar3 = Catch::operator<<((ostream *)poVar2,in_stack_ffffffffffffff88);
      std::operator<<((ostream *)poVar3,'\"');
      XmlEncode::~XmlEncode((XmlEncode *)0x1434ef);
    }
  }
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, std::string const& attribute ) {
        if( !name.empty() && !attribute.empty() )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }